

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
llvm::cl::TokenizeGNUCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  cl cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  StringRef SVar6;
  StringRef S;
  char C;
  SmallString<128U> Token;
  cl local_d9;
  char *local_d8;
  SmallVectorTemplateBase<const_char_*,_true> *local_d0;
  StringSaver *local_c8;
  SmallVectorTemplateBase<char,_true> local_c0;
  undefined1 local_b0 [128];
  
  local_c8 = (StringSaver *)Src.Length;
  pcVar3 = Src.Data;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x80;
  if (pcVar3 == (char *)0x0) {
LAB_00168fbb:
    if (local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
      S.Length._0_4_ =
           local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      S.Data = (char *)local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                       BeginX;
      S.Length._4_4_ = 0;
      SVar6 = StringSaver::save(local_c8,S);
      local_d8 = SVar6.Data;
      SmallVectorTemplateBase<const_char_*,_true>::push_back
                ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d8);
    }
    if ((char)NewArgv != '\0') {
      local_d8 = (char *)0x0;
      SmallVectorTemplateBase<const_char_*,_true>::push_back
                ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d8);
    }
    if ((undefined1 *)
        local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
        local_b0) {
      free(local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
    return;
  }
  pcVar4 = (char *)0x0;
  local_d0 = (SmallVectorTemplateBase<const_char_*,_true> *)Saver;
  do {
    if (local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size == 0) {
      while( true ) {
        if (pcVar4 == pcVar3) goto LAB_00168fbb;
        if (pcVar3 <= pcVar4) goto LAB_00169022;
        cVar1 = this[(long)pcVar4];
        if ((0x20 < (ulong)(byte)cVar1) || ((0x100002600U >> ((ulong)(byte)cVar1 & 0x3f) & 1) == 0))
        break;
        if (cVar1 == (cl)0xa && (char)NewArgv == '\x01') {
          local_d8 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d8);
        }
        pcVar4 = pcVar4 + 1;
      }
      if (pcVar4 == pcVar3) goto LAB_00168fbb;
    }
    Saver = (StringSaver *)local_d0;
    if (pcVar3 <= pcVar4) {
LAB_00169022:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    local_d9 = this[(long)pcVar4];
    pcVar5 = pcVar4 + 1;
    if (pcVar5 < pcVar3 && local_d9 == (cl)0x5c) {
      local_d8 = (char *)CONCAT71(local_d8._1_7_,this[(long)pcVar5]);
      SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_d8);
LAB_00168e2f:
      bVar2 = false;
      Saver = (StringSaver *)local_d0;
    }
    else if ((byte)local_d9 < 0x28) {
      if ((0x100002600U >> ((ulong)(byte)local_d9 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> ((ulong)(byte)local_d9 & 0x3f) & 1) == 0) goto LAB_00168fa5;
        bVar2 = true;
        if (pcVar5 != pcVar3) {
          do {
            if (pcVar3 <= pcVar5) goto LAB_00169022;
            if (this[(long)pcVar5] == local_d9) goto LAB_00168e2f;
            pcVar4 = pcVar5 + 1;
            if (pcVar5 + 1 == pcVar3) {
              pcVar4 = pcVar5;
            }
            if (this[(long)pcVar5] != (cl)0x5c) {
              pcVar4 = pcVar5;
            }
            if (pcVar3 <= pcVar4) goto LAB_00169022;
            local_d8 = (char *)CONCAT71(local_d8._1_7_,this[(long)pcVar4]);
            SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_d8);
            pcVar5 = pcVar4 + 1;
          } while (pcVar5 != pcVar3);
          bVar2 = true;
          Saver = (StringSaver *)local_d0;
        }
      }
      else {
        if (local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
          SVar6.Length._0_4_ =
               local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          SVar6.Data = (char *)local_c0.super_SmallVectorTemplateCommon<char,_void>.
                               super_SmallVectorBase.BeginX;
          SVar6.Length._4_4_ = 0;
          SVar6 = StringSaver::save(local_c8,SVar6);
          local_d8 = SVar6.Data;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_d8);
        }
        local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ =
             local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff00000000;
        bVar2 = false;
        pcVar5 = pcVar4;
      }
    }
    else {
LAB_00168fa5:
      SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_d9);
      bVar2 = false;
      Saver = (StringSaver *)local_d0;
      pcVar5 = pcVar4;
    }
    if ((bVar2) || (pcVar4 = pcVar5 + 1, pcVar4 == pcVar3)) goto LAB_00168fbb;
  } while( true );
}

Assistant:

void cl::TokenizeGNUCommandLine(StringRef Src, StringSaver &Saver,
                                SmallVectorImpl<const char *> &NewArgv,
                                bool MarkEOLs) {
  SmallString<128> Token;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    // Consume runs of whitespace.
    if (Token.empty()) {
      while (I != E && isWhitespace(Src[I])) {
        // Mark the end of lines in response files
        if (MarkEOLs && Src[I] == '\n')
          NewArgv.push_back(nullptr);
        ++I;
      }
      if (I == E)
        break;
    }

    char C = Src[I];

    // Backslash escapes the next character.
    if (I + 1 < E && C == '\\') {
      ++I; // Skip the escape.
      Token.push_back(Src[I]);
      continue;
    }

    // Consume a quoted string.
    if (isQuote(C)) {
      ++I;
      while (I != E && Src[I] != C) {
        // Backslash escapes the next character.
        if (Src[I] == '\\' && I + 1 != E)
          ++I;
        Token.push_back(Src[I]);
        ++I;
      }
      if (I == E)
        break;
      continue;
    }

    // End the token if this is whitespace.
    if (isWhitespace(C)) {
      if (!Token.empty())
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
      Token.clear();
      continue;
    }

    // This is a normal character.  Append it.
    Token.push_back(C);
  }

  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}